

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeTupleExtract<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  optional<unsigned_int> oVar1;
  undefined1 local_c0 [8];
  Result<unsigned_int> arity;
  string local_78 [32];
  undefined1 local_58 [8];
  Result<unsigned_int> _val;
  
  tupleArity<wasm::WATParser::ParseDefsCtx>((Result<unsigned_int> *)local_c0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_58,
             (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_c0);
  if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string(local_78,(string *)local_58);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_78);
    std::__cxx11::string::~string(local_78);
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_58);
    oVar1 = Lexer::takeU<unsigned_int>(&ctx->in);
    if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 ((long)&arity.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                 "expected tuple index",(allocator<char> *)local_78);
      Lexer::err((Err *)local_58,&ctx->in,
                 (string *)
                 ((long)&arity.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string
                ((string *)
                 ((long)&arity.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    }
    else {
      ParseDefsCtx::makeTupleExtract
                (__return_storage_ptr__,ctx,pos,annotations,local_c0._0_4_,
                 oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload);
    }
  }
  std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeTupleExtract(Ctx& ctx,
                          Index pos,
                          const std::vector<Annotation>& annotations) {
  auto arity = tupleArity(ctx);
  CHECK_ERR(arity);
  auto index = ctx.in.takeU32();
  if (!index) {
    return ctx.in.err("expected tuple index");
  }
  return ctx.makeTupleExtract(pos, annotations, *arity, *index);
}